

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::flagAcceptingStates(RBBITableBuilder *this)

{
  int32_t iVar1;
  void *obj;
  void *pvVar2;
  int index;
  UVector *this_00;
  int32_t index_00;
  UVector endMarkerNodes;
  UVector UStack_58;
  
  if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    UVector::UVector(&UStack_58,this->fStatus);
    if (*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      RBBINode::findNodes(*this->fTree,&UStack_58,endMark,this->fStatus);
      if ((*this->fStatus < U_ILLEGAL_ARGUMENT_ERROR) && (0 < UStack_58.count)) {
        index = 0;
        do {
          obj = UVector::elementAt(&UStack_58,index);
          this_00 = this->fDStates;
          if (0 < this_00->count) {
            index_00 = 0;
            do {
              pvVar2 = UVector::elementAt(this_00,index_00);
              iVar1 = UVector::indexOf(*(UVector **)((long)pvVar2 + 0x20),obj,0);
              if (-1 < iVar1) {
                if (*(int *)((long)pvVar2 + 4) == 0) {
                  *(uint *)((long)pvVar2 + 4) =
                       -(uint)(*(uint *)((long)obj + 0x7c) == 0) | *(uint *)((long)obj + 0x7c);
                }
                if ((*(int *)((long)pvVar2 + 4) == -1) && (*(int *)((long)obj + 0x7c) != 0)) {
                  *(int *)((long)pvVar2 + 4) = *(int *)((long)obj + 0x7c);
                }
                if (*(char *)((long)obj + 0x80) != '\0') {
                  *(undefined4 *)((long)pvVar2 + 8) = *(undefined4 *)((long)pvVar2 + 4);
                }
              }
              index_00 = index_00 + 1;
              this_00 = this->fDStates;
            } while (index_00 < this_00->count);
          }
          index = index + 1;
        } while (index < UStack_58.count);
      }
    }
    UVector::~UVector(&UStack_58);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagAcceptingStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     endMarkerNodes(*fStatus);
    RBBINode    *endMarker;
    int32_t     i;
    int32_t     n;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    fTree->findNodes(&endMarkerNodes, RBBINode::endMark, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }

    for (i=0; i<endMarkerNodes.size(); i++) {
        endMarker = (RBBINode *)endMarkerNodes.elementAt(i);
        for (n=0; n<fDStates->size(); n++) {
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(endMarker) >= 0) {
                // Any non-zero value for fAccepting means this is an accepting node.
                // The value is what will be returned to the user as the break status.
                // If no other value was specified, force it to -1.

                if (sd->fAccepting==0) {
                    // State hasn't been marked as accepting yet.  Do it now.
                    sd->fAccepting = endMarker->fVal;
                    if (sd->fAccepting == 0) {
                        sd->fAccepting = -1;
                    }
                }
                if (sd->fAccepting==-1 && endMarker->fVal != 0) {
                    // Both lookahead and non-lookahead accepting for this state.
                    // Favor the look-ahead.  Expedient for line break.
                    // TODO:  need a more elegant resolution for conflicting rules.
                    sd->fAccepting = endMarker->fVal;
                }
                // implicit else:
                // if sd->fAccepting already had a value other than 0 or -1, leave it be.

                // If the end marker node is from a look-ahead rule, set
                //   the fLookAhead field for this state also.
                if (endMarker->fLookAheadEnd) {
                    // TODO:  don't change value if already set?
                    // TODO:  allow for more than one active look-ahead rule in engine.
                    //        Make value here an index to a side array in engine?
                    sd->fLookAhead = sd->fAccepting;
                }
            }
        }
    }
}